

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

void __thiscall
Js::JavascriptRegExp::JavascriptRegExp
          (JavascriptRegExp *this,RegexPattern *pattern,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  ScriptContext *this_00;
  DebugWriter *this_01;
  DebugWriter *w;
  nullptr_t local_28;
  DynamicType *local_20;
  DynamicType *type_local;
  RegexPattern *pattern_local;
  JavascriptRegExp *this_local;
  
  local_20 = type;
  type_local = (DynamicType *)pattern;
  pattern_local = (RegexPattern *)this;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e3c878;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr
            (&this->pattern,(RegexPattern *)type_local);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr
            (&this->splitPattern,&local_28);
  w = (DebugWriter *)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->lastIndexVar,&w);
  this->lastIndexOrFlag = 0;
  TVar3 = Js::Type::GetTypeId(&local_20->super_Type);
  if (TVar3 != TypeIds_RegEx) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x14,"(type->GetTypeId() == TypeIds_RegEx)",
                                "type->GetTypeId() == TypeIds_RegEx");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pTVar6 = RecyclableObject::GetType((RecyclableObject *)this);
  BVar4 = Js::Type::AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties(pTVar6);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x15,
                                "(!this->GetType()->AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties())"
                                ,
                                "!this->GetType()->AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pTVar6 = RecyclableObject::GetType((RecyclableObject *)this);
  BVar4 = Js::Type::ThisAndPrototypesHaveNoSpecialProperties(pTVar6);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x16,
                                "(!this->GetType()->ThisAndPrototypesHaveNoSpecialProperties())",
                                "!this->GetType()->ThisAndPrototypesHaveNoSpecialProperties()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((DAT_01ec73d8 & 1) != 0) {
    this_00 = Js::Type::GetScriptContext(&local_20->super_Type);
    this_01 = ScriptContext::GetRegexDebugWriter(this_00);
    if (type_local == (DynamicType *)0x0) {
      UnifiedRegex::DebugWriter::PrintEOL(this_01,L"// REGEX CREATE");
    }
    else {
      UnifiedRegex::DebugWriter::Print(this_01,L"// REGEX CREATE ");
      UnifiedRegex::RegexPattern::Print((RegexPattern *)type_local,this_01);
      UnifiedRegex::DebugWriter::EOL(this_01);
    }
  }
  return;
}

Assistant:

JavascriptRegExp::JavascriptRegExp(UnifiedRegex::RegexPattern* pattern, DynamicType* type) :
        DynamicObject(type),
        pattern(pattern),
        splitPattern(nullptr),
        lastIndexVar(nullptr),
        lastIndexOrFlag(0)
    {
        Assert(type->GetTypeId() == TypeIds_RegEx);
        Assert(!this->GetType()->AreThisAndPrototypesEnsuredToHaveOnlyWritableDataProperties());
        Assert(!this->GetType()->ThisAndPrototypesHaveNoSpecialProperties());

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (REGEX_CONFIG_FLAG(RegexTracing))
        {
            UnifiedRegex::DebugWriter* w = type->GetScriptContext()->GetRegexDebugWriter();
            if (pattern == 0)
                w->PrintEOL(_u("// REGEX CREATE"));
            else
            {
                w->Print(_u("// REGEX CREATE "));
                pattern->Print(w);
                w->EOL();
            }
        }
#endif
    }